

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateCBTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_4::BlendConstantsTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BlendConstantsTestInstance *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkOffset3D offset;
  undefined8 uVar3;
  VkQueue log_00;
  bool bVar4;
  VkResult result;
  TestContext *this_00;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)18> *pHVar6;
  Buffer *this_01;
  size_type sVar7;
  PixelBufferAccess *pPVar8;
  Image *this_02;
  Allocator *allocator;
  ConstPixelBufferAccess *reference;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  float fVar9;
  float fVar10;
  allocator<char> local_1c9;
  string local_1c8;
  undefined4 local_1a8;
  allocator<char> local_1a1;
  string local_1a0;
  void *local_180;
  deInt32 local_178;
  undefined1 local_170 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  int local_128;
  float xCoord;
  int x;
  float yCoord;
  int y;
  int local_10c;
  int local_108;
  deInt32 frameHeight;
  deInt32 frameWidth;
  TextureFormat local_f8;
  undefined1 local_f0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_98;
  VkSubmitInfo submitInfo;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  undefined1 auStack_38 [8];
  VkClearColorValue clearColor;
  VkQueue queue;
  TestLog *log;
  BlendConstantsTestInstance *this_local;
  
  log = (TestLog *)this;
  this_local = (BlendConstantsTestInstance *)__return_storage_ptr__;
  this_00 = Context::getTestContext
                      ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  queue = (VkQueue)tcu::TestContext::getLog(this_00);
  clearColor._8_8_ =
       Context::getUniversalQueue((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  auStack_38 = (undefined1  [8])0x3f8000003f800000;
  clearColor._0_8_ = 0x3f8000003f800000;
  DynamicStateBaseClass::beginRenderPassWithClearColor
            (&this->super_DynamicStateBaseClass,(VkClearColorValue *)auStack_38);
  DynamicStateBaseClass::setDynamicViewportState(&this->super_DynamicStateBaseClass,0x80,0x80);
  DynamicStateBaseClass::setDynamicRasterizationState
            (&this->super_DynamicStateBaseClass,1.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            (&this->super_DynamicStateBaseClass,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  DynamicStateBaseClass::setDynamicBlendState(&this->super_DynamicStateBaseClass,0.33,0.1,0.66,0.5);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  this_03 = &(this->super_DynamicStateBaseClass).m_cmdBuffer;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DynamicStateBaseClass).m_pipeline.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar6->m_internal);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DynamicStateBaseClass).m_vertexBuffer);
  submitInfo.pSignalSemaphores = (VkSemaphore *)Draw::Buffer::object(this_01);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,*ppVVar5,0,1,&submitInfo.pSignalSemaphores,&vertexBuffer);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar5;
  sVar7 = std::
          vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
          ::size(&(this->super_DynamicStateBaseClass).m_data);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,pVVar2,sVar7 & 0xffffffff,1,0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar5);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar5);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_98 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  uVar3 = clearColor._8_8_;
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,uVar3,1,&uStack_98);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,clearColor._8_8_);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateCBTests.cpp"
                    ,0x7d);
  local_f8 = ::vk::mapVkFormat((this->super_DynamicStateBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_f0,&local_f8,0x80,0x80);
  tcu::Texture2D::allocLevel((Texture2D *)local_f0,0);
  local_108 = tcu::Texture2D::getWidth((Texture2D *)local_f0);
  local_10c = tcu::Texture2D::getHeight((Texture2D *)local_f0);
  pPVar8 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&yCoord,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar8,(Vec4 *)&yCoord);
  for (x = 0; x < local_10c; x = x + 1) {
    fVar9 = (float)x / ((float)local_10c * 0.5) - 1.0;
    for (local_128 = 0; local_128 < local_108; local_128 = local_128 + 1) {
      fVar10 = (float)local_128 / ((float)local_108 * 0.5) - 1.0;
      if ((((-1.0 <= fVar9) && (fVar9 <= 1.0)) && (-1.0 <= fVar10)) && (fVar10 <= 1.0)) {
        pPVar8 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.y,0.33,1.0,0.66,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar8,(Vec4 *)&zeroOffset.y,local_128,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_02 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DynamicStateBaseClass).m_colorTargetImage);
  uVar3 = clearColor._8_8_;
  allocator = Context::getDefaultAllocator
                        ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  local_178 = zeroOffset.x;
  local_180 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_170,this_02,(VkQueue)uVar3,allocator,
             VK_IMAGE_LAYOUT_GENERAL,offset,0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  log_00 = queue;
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_f0,0)->
               super_ConstPixelBufferAccess;
  bVar4 = tcu::fuzzyCompare((TestLog *)log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_170,0.05,COMPARE_LOG_RESULT);
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Image verification passed",&local_1c9);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Image verification failed",&local_1a1);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
  }
  local_1a8 = 1;
  tcu::Texture2D::~Texture2D((Texture2D *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log = m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		const vk::VkClearColorValue clearColor = { { 1.0f, 1.0f, 1.0f, 1.0f } };
		beginRenderPassWithClearColor(clearColor);

		// bind states here
		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicRasterizationState();
		setDynamicDepthStencilState();
		setDynamicBlendState(0.33f, 0.1f, 0.66f, 0.5f);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		const vk::VkDeviceSize vertexBufferOffset = 0;
		const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_data.size()), 1, 0, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);
		VK_CHECK(m_vk.queueWaitIdle(queue));

		//validation
		{
			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

			for (int y = 0; y < frameHeight; y++)
			{
				const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

					if ((yCoord >= -1.0f && yCoord <= 1.0f && xCoord >= -1.0f && xCoord <= 1.0f))
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.33f, 1.0f, 0.66f, 1.0f), x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
																							  vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}